

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

void __thiscall
slang::IntervalMap<int,_int,_0U>::overlap_iterator::unionWith
          (overlap_iterator *this,int *value,allocator_type *alloc)

{
  Path *other;
  Path *this_00;
  uint32_t *puVar1;
  int right;
  IntervalMap<int,_int,_0U> *pIVar2;
  size_type sVar3;
  pointer pEVar4;
  interval<int> iVar5;
  long lVar6;
  IntervalMap<int,_int,_0U> *pIVar7;
  pointer pEVar8;
  undefined8 uVar9;
  bool bVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  int iVar14;
  uint uVar15;
  BranchNode<int,_12U,_true> *self;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  void *pvVar19;
  undefined8 *puVar20;
  int iVar21;
  iterator nextIt;
  iterator local_70;
  
  pIVar2 = (this->super_iterator).super_const_iterator.map;
  uVar11 = (ulong)pIVar2->rootSize;
  if (pIVar2->height == 0) {
    if (uVar11 == 0) {
      uVar18 = 0;
    }
    else {
      iVar16 = (this->searchKey).left;
      uVar17 = 0;
      do {
        uVar18 = uVar17;
        if ((iVar16 <= *(int *)((long)&pIVar2->field_0 + uVar17 * 8)) ||
           (iVar16 <= *(int *)((long)&pIVar2->field_0 + uVar17 * 8 + 4) + 1)) break;
        uVar17 = uVar17 + 1;
        uVar18 = uVar11;
      } while (uVar11 != uVar17);
    }
    const_iterator::setRoot((const_iterator *)this,(uint32_t)uVar18);
  }
  else {
    if (uVar11 == 0) {
      uVar18 = 0;
    }
    else {
      iVar16 = (this->searchKey).left;
      uVar17 = 0;
      do {
        uVar18 = uVar17;
        if ((iVar16 <= *(int *)((long)&pIVar2->field_0 + uVar17 * 8 + 0x60)) ||
           (iVar16 <= *(int *)((long)&pIVar2->field_0 + uVar17 * 8 + 100) + 1)) break;
        uVar17 = uVar17 + 1;
        uVar18 = uVar11;
      } while (uVar11 != uVar17);
    }
    const_iterator::setRoot((const_iterator *)this,(uint32_t)uVar18);
    treeFindUnion(this);
  }
  sVar3 = (this->super_iterator).super_const_iterator.path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  if (sVar3 != 0) {
    other = &(this->super_iterator).super_const_iterator.path;
    pEVar4 = (other->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    if (pEVar4->offset < pEVar4->size) {
      uVar11 = (ulong)pEVar4[sVar3 - 1].offset;
      pvVar19 = pEVar4[sVar3 - 1].node;
      iVar16 = *(int *)((long)pvVar19 + uVar11 * 8);
      iVar21 = *(int *)((long)pvVar19 + uVar11 * 8 + 4);
      iVar14 = (this->searchKey).left;
      right = (this->searchKey).right;
      if (iVar21 + 1 < iVar14 || right + 1 < iVar16) {
        IntervalMap<int,_int,_0U>::iterator::insert(&this->super_iterator,iVar14,right,value,alloc);
      }
      else {
        iVar5 = this->searchKey;
        iVar14 = iVar5.left;
        if (iVar14 < iVar16) {
          iVar16 = iVar14;
        }
        *(int *)((long)pvVar19 + uVar11 * 8) = iVar16;
        iVar16 = iVar5.right;
        if (iVar16 < iVar21) {
          iVar16 = iVar21;
        }
        *(int *)((long)pvVar19 + uVar11 * 8 + 4) = iVar16;
        this->searchKey = *(interval<int> *)((long)pvVar19 + uVar11 * 8);
        uVar12 = (int)sVar3 - 1;
        if (uVar12 != 0) {
          lVar13 = (ulong)uVar12 << 4;
          do {
            uVar11 = (ulong)*(uint *)((long)pEVar4 + lVar13 + -4);
            lVar6 = *(long *)((long)&pEVar4[-1].node + lVar13);
            iVar16 = (this->searchKey).left;
            iVar21 = *(int *)(lVar6 + 0x60 + uVar11 * 8);
            if (iVar16 < iVar21) {
              iVar21 = iVar16;
            }
            iVar16 = *(int *)(lVar6 + 100 + uVar11 * 8);
            *(int *)(lVar6 + 0x60 + uVar11 * 8) = iVar21;
            iVar21 = (this->searchKey).right;
            if (iVar21 < iVar16) {
              iVar21 = iVar16;
            }
            *(int *)(lVar6 + 100 + uVar11 * 8) = iVar21;
            lVar13 = lVar13 + -0x10;
          } while (lVar13 != 0);
        }
      }
      this_00 = &local_70.super_const_iterator.path;
      pEVar4 = (pointer)local_70.super_const_iterator.path.path.
                        super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.firstElement;
      do {
        while( true ) {
          pIVar7 = (this->super_iterator).super_const_iterator.map;
          pEVar8 = (this->super_iterator).super_const_iterator.path.path.
                   super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
          sVar3 = (this->super_iterator).super_const_iterator.path.path.
                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
          uVar12 = pEVar8[sVar3 - 1].size;
          uVar11 = (ulong)pEVar8[sVar3 - 1].offset;
          uVar15 = pEVar8[sVar3 - 1].offset + 1;
          if (pIVar7->height != 0) break;
          if (uVar12 <= uVar15) {
            return;
          }
          pvVar19 = pEVar8[sVar3 - 1].node;
          if ((this->searchKey).right + 1 < *(int *)((long)pvVar19 + (ulong)uVar15 * 8)) {
            return;
          }
          puVar20 = (undefined8 *)((long)pvVar19 + (ulong)uVar15 * 8);
LAB_004fa0e4:
          uVar9 = *puVar20;
          iVar16 = *(int *)((long)pvVar19 + uVar11 * 8);
          iVar21 = *(int *)((long)pvVar19 + uVar11 * 8 + 4);
          iVar14 = (int)uVar9;
          if (iVar14 < iVar16) {
            iVar16 = iVar14;
          }
          *(int *)((long)pvVar19 + uVar11 * 8) = iVar16;
          iVar16 = (int)((ulong)uVar9 >> 0x20);
          if (iVar16 < iVar21) {
            iVar16 = iVar21;
          }
          *(int *)((long)pvVar19 + uVar11 * 8 + 4) = iVar16;
          this->searchKey = *(interval<int> *)((long)pvVar19 + uVar11 * 8);
          pEVar8[sVar3 - 1].offset = uVar15;
          IntervalMap<int,_int,_0U>::iterator::erase(&this->super_iterator,alloc,false);
          puVar1 = &(this->super_iterator).super_const_iterator.path.path.
                    super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                    [(this->super_iterator).super_const_iterator.path.path.
                     super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].offset;
          *puVar1 = *puVar1 - 1;
        }
        if (uVar15 < uVar12) {
          pvVar19 = pEVar8[sVar3 - 1].node;
          if (*(int *)((long)pvVar19 + (ulong)uVar15 * 8) <= (this->searchKey).right + 1) {
            puVar20 = (undefined8 *)((long)pvVar19 + (ulong)uVar15 * 8);
            goto LAB_004fa0e4;
          }
        }
        if (uVar15 != uVar12) {
          return;
        }
        local_70.super_const_iterator.map = pIVar7;
        SmallVector<slang::IntervalMapDetails::Path::Entry,_2UL>::SmallVector
                  (&this_00->path,(Base *)other);
        IntervalMapDetails::Path::moveRight(this_00,pIVar2->height);
        if ((((local_70.super_const_iterator.path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len == 0) ||
             ((local_70.super_const_iterator.path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->size <=
              (local_70.super_const_iterator.path.path.
               super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->offset)) ||
            (local_70.super_const_iterator.path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
             [local_70.super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].size == 0)) ||
           ((this->searchKey).right + 1 <
            *local_70.super_const_iterator.path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
             [local_70.super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].node)) {
          if (local_70.super_const_iterator.path.path.
              super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ != pEVar4) {
            operator_delete(local_70.super_const_iterator.path.path.
                            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
          }
          return;
        }
        uVar9 = *local_70.super_const_iterator.path.path.
                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_
                 [local_70.super_const_iterator.path.path.
                  super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].node;
        pEVar8 = (this->super_iterator).super_const_iterator.path.path.
                 super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
        sVar3 = (this->super_iterator).super_const_iterator.path.path.
                super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
        uVar11 = (ulong)pEVar8[sVar3 - 1].offset;
        pvVar19 = pEVar8[sVar3 - 1].node;
        iVar16 = *(int *)((long)pvVar19 + uVar11 * 8);
        iVar21 = *(int *)((long)pvVar19 + uVar11 * 8 + 4);
        iVar14 = (int)uVar9;
        if (iVar14 < iVar16) {
          iVar16 = iVar14;
        }
        *(int *)((long)pvVar19 + uVar11 * 8) = iVar16;
        iVar16 = (int)((ulong)uVar9 >> 0x20);
        if (iVar16 < iVar21) {
          iVar16 = iVar21;
        }
        *(int *)((long)pvVar19 + uVar11 * 8 + 4) = iVar16;
        this->searchKey = *(interval<int> *)((long)pvVar19 + uVar11 * 8);
        uVar12 = (int)sVar3 - 1;
        if (uVar12 != 0) {
          lVar13 = (ulong)uVar12 << 4;
          do {
            uVar11 = (ulong)*(uint *)((long)pEVar8 + lVar13 + -4);
            lVar6 = *(long *)((long)&pEVar8[-1].node + lVar13);
            iVar16 = (this->searchKey).left;
            iVar21 = *(int *)(lVar6 + 0x60 + uVar11 * 8);
            if (iVar16 < iVar21) {
              iVar21 = iVar16;
            }
            iVar16 = *(int *)(lVar6 + 100 + uVar11 * 8);
            *(int *)(lVar6 + 0x60 + uVar11 * 8) = iVar21;
            iVar21 = (this->searchKey).right;
            if (iVar21 < iVar16) {
              iVar21 = iVar16;
            }
            *(int *)(lVar6 + 100 + uVar11 * 8) = iVar21;
            lVar13 = lVar13 + -0x10;
          } while (lVar13 != 0);
        }
        bVar10 = IntervalMap<int,_int,_0U>::iterator::erase(&local_70,alloc,true);
        if (bVar10) {
          SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::operator=
                    ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)other,
                     (SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this_00);
          IntervalMapDetails::Path::moveLeft(other,pIVar2->height);
        }
        if (local_70.super_const_iterator.path.path.
            super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ != pEVar4) {
          operator_delete(local_70.super_const_iterator.path.path.
                          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_);
        }
      } while( true );
    }
  }
  IntervalMap<int,_int,_0U>::iterator::insert
            (&this->super_iterator,(this->searchKey).left,(this->searchKey).right,value,alloc);
  return;
}

Assistant:

void IntervalMap<TKey, TValue, N>::overlap_iterator::unionWith(const TValue& value,
                                                               allocator_type& alloc) {
    using namespace IntervalMapDetails;

    auto& map = *this->map;
    auto& path = this->path;
    if (this->isFlat()) {
        this->setRoot(map.rootLeaf.findUnionLeft(0, map.rootSize, searchKey));
    }
    else {
        this->setRoot(map.rootBranch.findUnionLeft(0, map.rootSize, searchKey));
        treeFindUnion();
    }

    // The iterator now points to one of the following:
    // - The first existing interval that overlaps (or is adjacent to) the search key
    // - The correct place to insert the search key as a new interval
    // - The end of the map (also the correct place to insert)
    if (!valid()) {
        // We're at the end of the map so just insert and we're done.
        this->insert(searchKey.left, searchKey.right, value, alloc);
        return;
    }

    auto getCurrKey = [&]() -> interval<TKey>& {
        auto offset = path.leafOffset();
        return this->isFlat() ? path.template leaf<RootLeaf>().keyAt(offset)
                              : path.template leaf<Leaf>().keyAt(offset);
    };

    auto updateCurrKey = [&](interval<TKey> newKey) {
        // Expand the current entry to match our new item.
        auto& currKey = getCurrKey();
        currKey.unionWith(newKey);
        searchKey = currKey;
    };

    if (!getCurrKey().overlapsOrAdjacent(searchKey)) {
        this->insert(searchKey.left, searchKey.right, value, alloc);
    }
    else {
        // Otherwise expand the current entry to match our new item.
        updateCurrKey(searchKey);
        this->updateParentBounds(path.height(), searchKey);
    }

    // Our new interval is inserted or updated. Continue forward and
    // merge all later intervals that overlap with this one.
    while (true) {
        uint32_t offset = path.leafOffset() + 1;
        bool canUnionRight;
        interval<TKey> currKey;
        if (this->isFlat()) {
            auto& leaf = path.template leaf<RootLeaf>();
            canUnionRight = leaf.canUnionRight(offset, path.leafSize(), searchKey);
            currKey = leaf.keyAt(offset);
        }
        else {
            auto& leaf = path.template leaf<Leaf>();
            canUnionRight = leaf.canUnionRight(offset, path.leafSize(), searchKey);
            currKey = leaf.keyAt(offset);
        }

        if (canUnionRight) {
            // This does not change our parent bounds so no need to update.
            updateCurrKey(currKey);

            path.leafOffset() = offset;
            bool modifiedPath = this->erase(alloc, false);
            SLANG_ASSERT(!modifiedPath);

            path.leafOffset()--;
        }
        else if (offset == path.leafSize() && !this->isFlat()) {
            // Copy our iterator and advance to the next node to see if we can merge
            // with it. This intentionally slices the object since we don't need the
            // wider overlapped_iterator here.
            iterator nextIt = *this;
            nextIt.path.moveRight(map.height);
            if (!nextIt.valid() || !nextIt.path.template leaf<Leaf>().canUnionRight(
                                       0, nextIt.path.leafSize(), searchKey)) {
                // Nope, we're done.
                return;
            }

            // Merge and erase the next elem.
            updateCurrKey(nextIt.path.template leaf<Leaf>().keyAt(0));
            this->updateParentBounds(path.height(), searchKey);

            if (nextIt.erase(alloc, true)) {
                // The erase operation deleted nodes so our path is invalid.
                // Get back to a good state by copying from the nextIt's path
                // and then moving back left.
                path = nextIt.path;
                path.moveLeft(map.height);
            }
        }
        else {
            return;
        }
    }
}